

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_s2point_vector.h
# Opt level: O0

S2Point * __thiscall
s2coding::EncodedS2PointVector::operator[]
          (S2Point *__return_storage_ptr__,EncodedS2PointVector *this,int i)

{
  ostream *poVar1;
  VType *pVVar2;
  S2LogMessage local_28;
  int local_14;
  EncodedS2PointVector *pEStack_10;
  int i_local;
  EncodedS2PointVector *this_local;
  
  if (this->format_ == UNCOMPRESSED) {
    pVVar2 = (VType *)((this->field_2).cell_ids_.blocks.offsets_.data_ + (long)i * 0x18);
    __return_storage_ptr__->c_[0] = *pVVar2;
    __return_storage_ptr__->c_[1] = pVVar2[1];
    __return_storage_ptr__->c_[2] = pVVar2[2];
  }
  else {
    local_14 = i;
    pEStack_10 = this;
    if (this->format_ != CELL_IDS) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.h"
                 ,0x85,kFatal,(ostream *)&std::cerr);
      poVar1 = S2LogMessage::stream(&local_28);
      std::operator<<(poVar1,"Unrecognized format");
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_28);
    }
    DecodeCellIdsFormat(__return_storage_ptr__,this,i);
  }
  return __return_storage_ptr__;
}

Assistant:

inline S2Point EncodedS2PointVector::operator[](int i) const {
  switch (format_) {
    case Format::UNCOMPRESSED:
      return uncompressed_.points[i];

    case Format::CELL_IDS:
      return DecodeCellIdsFormat(i);

    default:
      S2_LOG(DFATAL) << "Unrecognized format";
      return S2Point();
  }
}